

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O1

lys_node *
lys_node_dup_recursion
          (lys_module *module,lys_node *parent,lys_node *node,unres_schema *unres,int shallow,
          int finalize)

{
  byte bVar1;
  uint8_t size;
  ushort uVar2;
  LYS_NODE LVar3;
  lys_iffeature *plVar4;
  ushort uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  lys_node *plVar9;
  lys_node *plVar10;
  char *pcVar11;
  lys_iffeature *plVar12;
  uint8_t *__dest;
  lys_feature **pplVar13;
  lys_when *plVar14;
  lys_restr *plVar15;
  lys_node *plVar16;
  void *pvVar17;
  lys_module *plVar18;
  lys_node *plVar19;
  lys_ext_instance **pplVar20;
  lys_ext_instance *plVar21;
  lys_ext *plVar22;
  undefined8 *new_item;
  lys_node *plVar23;
  lys_node *plVar24;
  lys_node *plVar25;
  size_t __size;
  ly_ctx *plVar26;
  undefined8 uVar27;
  lys_node_list *plVar28;
  ulong uVar29;
  long lVar30;
  lys_node *plVar31;
  ulong uVar32;
  lys_module *module_00;
  int_log_opts local_a0;
  uint local_9c;
  int_log_opts prev_ilo;
  uint size1;
  lys_node *local_90;
  lys_node *local_88;
  lys_node *local_80;
  lys_node *local_78;
  uint local_70;
  int local_6c;
  uint size2;
  lys_node_list *list_orig;
  lys_module *local_58;
  int local_4c;
  lys_node *local_48;
  lys_node *local_40;
  ly_ctx *local_38;
  
  plVar26 = module->ctx;
  LVar3 = node->nodetype;
  _size2 = node;
  list_orig = (lys_node_list *)unres;
  local_4c = shallow;
  local_40 = node;
  if ((int)LVar3 < 0x80) {
    if ((int)LVar3 < 0x10) {
      switch(LVar3) {
      case LYS_CONTAINER:
        plVar9 = (lys_node *)calloc(1,0x90);
        local_88 = (lys_node *)0x0;
        local_78 = (lys_node *)0x0;
        local_90 = (lys_node *)0x0;
        local_80 = (lys_node *)0x0;
        plVar10 = (lys_node *)0x0;
        _prev_ilo = (lys_node *)0x0;
        plVar23 = plVar9;
        break;
      case LYS_CHOICE:
        plVar9 = (lys_node *)calloc(1,0x78);
        local_78 = (lys_node *)0x0;
        local_90 = (lys_node *)0x0;
        local_80 = (lys_node *)0x0;
        plVar10 = (lys_node *)0x0;
        _prev_ilo = (lys_node *)0x0;
        plVar23 = (lys_node *)0x0;
        local_88 = plVar9;
        break;
      default:
        goto switchD_001621a7_caseD_3;
      case LYS_LEAF:
        local_78 = (lys_node *)calloc(1,0xd0);
        local_90 = (lys_node *)0x0;
        local_80 = (lys_node *)0x0;
        plVar10 = (lys_node *)0x0;
        _prev_ilo = (lys_node *)0x0;
        plVar9 = local_78;
        plVar23 = (lys_node *)0x0;
        local_88 = (lys_node *)0x0;
        break;
      case LYS_LEAFLIST:
        local_90 = (lys_node *)calloc(1,0xd8);
        local_78 = (lys_node *)0x0;
        local_80 = (lys_node *)0x0;
        plVar10 = (lys_node *)0x0;
        _prev_ilo = (lys_node *)0x0;
        plVar9 = local_90;
        plVar23 = (lys_node *)0x0;
        local_88 = (lys_node *)0x0;
      }
LAB_001622d8:
      plVar16 = (lys_node *)0x0;
    }
    else {
      if (LVar3 == LYS_LIST) {
        local_80 = (lys_node *)calloc(1,0xa8);
        local_78 = (lys_node *)0x0;
        local_90 = (lys_node *)0x0;
        plVar10 = (lys_node *)0x0;
        _prev_ilo = (lys_node *)0x0;
        plVar9 = local_80;
        plVar23 = (lys_node *)0x0;
        local_88 = (lys_node *)0x0;
        goto LAB_001622d8;
      }
      if (LVar3 == LYS_ANYXML) {
LAB_00162292:
        plVar10 = (lys_node *)calloc(1,0x80);
        local_78 = (lys_node *)0x0;
        local_90 = (lys_node *)0x0;
        local_80 = (lys_node *)0x0;
        _prev_ilo = (lys_node *)0x0;
        plVar9 = plVar10;
        plVar23 = (lys_node *)0x0;
        local_88 = (lys_node *)0x0;
        goto LAB_001622d8;
      }
      if (LVar3 != LYS_CASE) goto switchD_001621a7_caseD_3;
      plVar9 = (lys_node *)calloc(1,0x70);
      plVar23 = (lys_node *)0x0;
      local_88 = (lys_node *)0x0;
      local_78 = (lys_node *)0x0;
      local_90 = (lys_node *)0x0;
      local_80 = (lys_node *)0x0;
      plVar10 = (lys_node *)0x0;
      _prev_ilo = (lys_node *)0x0;
      plVar16 = plVar9;
    }
    plVar24 = local_40;
    if (plVar9 == (lys_node *)0x0) {
      ly_log(plVar26,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_node_dup_recursion");
      return (lys_node *)0x0;
    }
    local_6c = finalize;
    pcVar11 = lydict_insert(plVar26,local_40->name,0);
    plVar9->name = pcVar11;
    pcVar11 = lydict_insert(plVar26,plVar24->dsc,0);
    plVar9->dsc = pcVar11;
    pcVar11 = lydict_insert(plVar26,plVar24->ref,0);
    plVar28 = list_orig;
    plVar9->ref = pcVar11;
    plVar9->flags = plVar24->flags;
    plVar9->module = module;
    plVar9->nodetype = plVar24->nodetype;
    plVar9->prev = plVar9;
    iVar6 = unres_schema_find((unres_schema *)list_orig,-1,&plVar24->ext,UNRES_EXT);
    if (iVar6 == -1) {
      size = plVar24->ext_size;
      plVar9->ext_size = size;
      iVar6 = lys_ext_dup(plVar26,module,plVar24->ext,size,plVar9,LYEXT_PAR_NODE,&plVar9->ext,
                          local_4c,(unres_schema *)plVar28);
      if (iVar6 != 0) goto LAB_0016309b;
    }
    bVar1 = plVar24->iffeature_size;
    local_38 = plVar26;
    if ((ulong)bVar1 != 0) {
      plVar9->iffeature_size = bVar1;
      plVar12 = (lys_iffeature *)calloc((ulong)bVar1,0x20);
      plVar9->iffeature = plVar12;
      plVar24 = local_40;
      if (plVar12 == (lys_iffeature *)0x0) {
LAB_00163055:
        ly_log(local_38,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_node_dup_recursion"
              );
        goto LAB_0016309b;
      }
    }
    iVar6 = local_4c;
    plVar28 = list_orig;
    local_58 = module;
    local_48 = plVar9;
    if (local_4c == 0) {
      plVar25 = parent;
      if (plVar24->iffeature_size != '\0') {
        uVar32 = 0;
        do {
          resolve_iffeature_getsizes(plVar24->iffeature + uVar32,&local_9c,&local_70);
          plVar24 = local_40;
          if (local_9c != 0) {
            uVar29 = (ulong)((local_9c & 3) != 0 || local_9c >> 2 != 0);
            __dest = (uint8_t *)malloc(uVar29);
            plVar12 = local_48->iffeature;
            plVar12[uVar32].expr = __dest;
            if (__dest == (uint8_t *)0x0) goto LAB_00163077;
            memcpy(__dest,local_40->iffeature[uVar32].expr,uVar29);
            pplVar13 = (lys_feature **)calloc((ulong)local_70,8);
            plVar24 = local_40;
            plVar12[uVar32].features = pplVar13;
            if (pplVar13 == (lys_feature **)0x0) {
              ly_log(local_38,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                     "lys_node_dup_recursion");
              plVar9 = local_48;
              free(local_48->iffeature[uVar32].expr);
              goto LAB_0016309b;
            }
            if (local_70 != 0) {
              lVar30 = 0;
              uVar29 = 0;
              do {
                plVar9 = local_48;
                iVar6 = unres_schema_dup(local_58,(unres_schema *)list_orig,
                                         (void *)((long)plVar24->iffeature[uVar32].features + lVar30
                                                 ),UNRES_IFFEAT,
                                         (void *)((long)local_48->iffeature[uVar32].features +
                                                 lVar30));
                if (iVar6 == 1) {
                  *(undefined8 *)((long)plVar9->iffeature[uVar32].features + lVar30) =
                       *(undefined8 *)((long)plVar24->iffeature[uVar32].features + lVar30);
                }
                else {
                  plVar9 = local_48;
                  if (iVar6 == -1) goto LAB_0016309b;
                }
                uVar29 = uVar29 + 1;
                lVar30 = lVar30 + 8;
              } while (uVar29 < local_70);
            }
          }
          plVar9 = local_48;
          plVar28 = list_orig;
          plVar12 = plVar24->iffeature;
          plVar4 = local_48->iffeature;
          plVar4[uVar32].ext_size = plVar12[uVar32].ext_size;
          iVar6 = lys_ext_dup(local_38,local_58,plVar12[uVar32].ext,plVar12[uVar32].ext_size,
                              plVar4 + uVar32,LYEXT_PAR_IFFEATURE,&plVar4[uVar32].ext,0,
                              (unres_schema *)list_orig);
          if (iVar6 != 0) goto LAB_0016309b;
          uVar32 = uVar32 + 1;
          iVar6 = local_4c;
        } while (uVar32 < plVar24->iffeature_size);
      }
      do {
        plVar26 = local_38;
        iVar8 = local_6c;
        uVar5 = 1;
        plVar24 = plVar25;
        while( true ) {
          if (plVar24 == (lys_node *)0x0) goto LAB_00162705;
          if (plVar24->nodetype != LYS_USES) break;
          plVar24 = plVar24->parent;
        }
      } while ((plVar24->nodetype == LYS_AUGMENT) &&
              (plVar25 = plVar24->prev, plVar24->prev != (lys_node *)0x0));
      uVar5 = plVar24->flags & 3;
LAB_00162705:
      if (local_6c == 2) {
        uVar5 = plVar9->flags & 0xfff8;
LAB_0016298d:
        plVar9->flags = uVar5;
      }
      else if (local_6c == 1) {
        uVar2 = plVar9->flags;
        if ((uVar2 & 4) == 0) {
          if (plVar9->nodetype != LYS_USES) {
            plVar9->flags = uVar2 & 0xfff8 | uVar5;
          }
          uVar5 = parent->flags & 0x38;
          if ((plVar9->flags & 0x38) < uVar5) {
            uVar5 = uVar5 | plVar9->flags & 0xffc7;
            goto LAB_0016298d;
          }
        }
        else if (((uVar5 & 2) != 0) && ((uVar2 & 1) != 0)) {
          ly_vlog(local_38,LYE_INARG,LY_VLOG_LYS,plVar9,"true","config");
          ly_vlog(plVar26,LYE_SPEC,LY_VLOG_PREV,(void *)0x0,
                  "State nodes cannot have configuration nodes as children.");
          goto LAB_0016309b;
        }
      }
      iVar7 = lys_node_addchild(parent,plVar9->module,plVar9,0);
      if (iVar7 != 0) goto LAB_0016309b;
      plVar24 = local_40;
      plVar25 = _prev_ilo;
      if ((local_40->nodetype & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
        for (plVar31 = local_40->child; plVar31 != (lys_node *)0x0; plVar31 = plVar31->next) {
          if (((plVar31->nodetype & LYS_GROUPING) == LYS_UNKNOWN) &&
             (plVar19 = lys_node_dup_recursion
                                  (local_58,plVar9,plVar31,(unres_schema *)plVar28,0,iVar8),
             plVar24 = local_40, plVar25 = _prev_ilo, plVar19 == (lys_node *)0x0))
          goto LAB_0016309b;
        }
      }
      module = local_58;
      if ((((iVar8 == 1) && (plVar9->nodetype == LYS_LIST)) && ((plVar9->flags & 1) != 0)) &&
         (plVar24->padding[2] == '\0')) {
        ly_vlog(local_38,LYE_MISSCHILDSTMT,LY_VLOG_LYS,plVar9,"key","list");
        goto LAB_0016309b;
      }
    }
    else {
      memcpy(plVar9->iffeature,plVar24->iffeature,(ulong)plVar9->iffeature_size << 5);
      plVar24 = local_40;
      plVar25 = _prev_ilo;
    }
    plVar31 = local_80;
    LVar3 = plVar24->nodetype;
    if ((int)LVar3 < 0x80) {
      if ((int)LVar3 < 0x10) {
        switch(LVar3) {
        case LYS_CONTAINER:
          if ((lys_when *)plVar24[1].name != (lys_when *)0x0) {
            plVar14 = lys_when_dup(module,(lys_when *)plVar24[1].name,iVar6,(unres_schema *)plVar28)
            ;
            plVar23[1].name = (char *)plVar14;
            plVar24 = local_40;
            if (plVar14 == (lys_when *)0x0) goto LAB_0016309b;
          }
          pcVar11 = lydict_insert(local_38,*(char **)&plVar24[1].flags,0);
          plVar10 = local_40;
          *(char **)&plVar23[1].flags = pcVar11;
          if ((lys_restr *)local_40[1].dsc == (lys_restr *)0x0) {
            return plVar9;
          }
          plVar15 = lys_restr_dup(module,(lys_restr *)local_40[1].dsc,(uint)local_40->padding[1],
                                  iVar6,(unres_schema *)plVar28);
          plVar23[1].dsc = (char *)plVar15;
          if (plVar15 != (lys_restr *)0x0) {
            plVar23->padding[1] = plVar10->padding[1];
            return plVar9;
          }
          goto LAB_0016309b;
        case LYS_CHOICE:
          if (*(lys_when **)plVar24->hash != (lys_when *)0x0) {
            plVar14 = lys_when_dup(module,*(lys_when **)plVar24->hash,iVar6,(unres_schema *)plVar28)
            ;
            *(lys_when **)local_88->hash = plVar14;
            plVar24 = local_40;
            if (plVar14 == (lys_when *)0x0) goto LAB_0016309b;
          }
          plVar26 = local_38;
          pcVar11 = plVar24[1].name;
          if (iVar6 != 0) {
            local_88[1].name = pcVar11;
            return plVar9;
          }
          if (pcVar11 == (char *)0x0) {
            unres_schema_dup(module,(unres_schema *)plVar28,plVar24,UNRES_CHOICE_DFLT,local_88);
            return plVar9;
          }
          plVar18 = plVar9->module;
          if ((plVar18->field_0x40 & 1) != 0) {
            plVar18 = (lys_module *)plVar18->data;
          }
          iVar6 = lys_get_sibling(local_88->child,plVar18->name,0,*(char **)pcVar11,0,0x807d,
                                  (lys_node **)(local_88 + 1));
          if (iVar6 == 0) {
            return plVar9;
          }
          uVar27 = 0xcda;
          goto LAB_0016288b;
        default:
          goto switchD_00162425_caseD_3;
        case LYS_LEAF:
          list_orig = (lys_node_list *)&local_78[1].ref;
          iVar8 = lys_ingrouping(plVar9);
          iVar6 = lys_type_dup(module,plVar9,(lys_type *)list_orig,(lys_type *)&plVar24[1].ref,iVar8
                               ,iVar6,(unres_schema *)plVar28);
          plVar23 = local_40;
          plVar18 = local_58;
          if (iVar6 != 0) goto LAB_0016309b;
          plVar10 = (lys_node *)lydict_insert(local_58->ctx,(char *)local_40[1].next,0);
          local_78[1].next = plVar10;
          plVar10 = local_78;
          if (plVar23[1].prev != (lys_node *)0x0) {
            ly_ilo_change((ly_ctx *)0x0,ILO_IGNORE,&local_a0,(ly_err_item **)0x0);
            plVar18 = local_40->module;
            module_00 = (lys_module *)0x0;
            if ((plVar18 != (lys_module *)0x0) &&
               (module_00 = plVar18, (plVar18->field_0x40 & 1) != 0)) {
              module_00 = (lys_module *)plVar18->data;
            }
            plVar23 = (lys_node *)transform_schema2json(module_00,(char *)local_40[1].prev);
            plVar10 = local_78;
            local_78[1].prev = plVar23;
            ly_ilo_restore((ly_ctx *)0x0,local_a0,(ly_err_item *)0x0,0);
            plVar18 = local_58;
            plVar23 = local_40;
            if (plVar10[1].prev == (lys_node *)0x0) {
              plVar23 = (lys_node *)lydict_insert(local_38,(char *)local_40[1].prev,0);
              local_78[1].prev = plVar23;
              plVar23 = local_40;
              plVar10 = local_78;
            }
          }
          if ((lys_restr *)plVar23[1].dsc != (lys_restr *)0x0) {
            plVar15 = lys_restr_dup(plVar18,(lys_restr *)plVar23[1].dsc,(uint)plVar23->padding[3],
                                    local_4c,(unres_schema *)plVar28);
            local_78[1].dsc = (char *)plVar15;
            if (plVar15 == (lys_restr *)0x0) goto LAB_0016309b;
            local_78->padding[3] = plVar23->padding[3];
            plVar10 = local_78;
          }
          if ((lys_when *)plVar23[1].name == (lys_when *)0x0) {
            return plVar9;
          }
          plVar14 = lys_when_dup(plVar18,(lys_when *)plVar23[1].name,local_4c,
                                 (unres_schema *)plVar28);
          plVar10[1].name = (char *)plVar14;
          break;
        case LYS_LEAFLIST:
          list_orig = (lys_node_list *)&local_90[1].ref;
          iVar8 = lys_ingrouping(plVar9);
          iVar8 = lys_type_dup(module,plVar9,(lys_type *)list_orig,(lys_type *)&plVar24[1].ref,iVar8
                               ,iVar6,(unres_schema *)plVar28);
          plVar23 = local_40;
          if (iVar8 != 0) goto LAB_0016309b;
          plVar16 = (lys_node *)lydict_insert(local_58->ctx,(char *)local_40[1].next,0);
          plVar10 = local_90;
          local_90[1].next = plVar16;
          *(undefined4 *)&local_90[1].priv = *(undefined4 *)&plVar23[1].priv;
          *(undefined4 *)((long)&local_90[1].priv + 4) = *(undefined4 *)((long)&plVar23[1].priv + 4)
          ;
          if ((lys_restr *)plVar23[1].dsc != (lys_restr *)0x0) {
            plVar15 = lys_restr_dup(local_58,(lys_restr *)plVar23[1].dsc,(uint)plVar23->padding[3],
                                    iVar6,(unres_schema *)plVar28);
            plVar10[1].dsc = (char *)plVar15;
            if (plVar15 == (lys_restr *)0x0) goto LAB_0016309b;
            plVar10->padding[3] = plVar23->padding[3];
          }
          if (plVar23[1].prev == (lys_node *)0x0) {
LAB_00162c43:
            if ((lys_when *)plVar23[1].name == (lys_when *)0x0) {
              return local_48;
            }
            plVar14 = lys_when_dup(local_58,(lys_when *)plVar23[1].name,iVar6,
                                   (unres_schema *)plVar28);
            local_90[1].name = (char *)plVar14;
            return local_48;
          }
          bVar1 = plVar23->padding[2];
          plVar9 = (lys_node *)malloc((ulong)((uint)bVar1 * 8));
          plVar26 = local_38;
          plVar10[1].prev = plVar9;
          if (plVar9 != (lys_node *)0x0) {
            plVar10->padding[2] = bVar1;
            plVar23 = local_40;
            if (bVar1 != 0) {
              uVar32 = 0;
              do {
                pcVar11 = lydict_insert(plVar26,*(char **)((local_40[1].prev)->padding +
                                                          uVar32 * 8 + -0x1c),0);
                *(char **)((plVar10[1].prev)->padding + uVar32 * 8 + -0x1c) = pcVar11;
                uVar32 = uVar32 + 1;
                plVar23 = local_40;
              } while (uVar32 < plVar10->padding[2]);
            }
            goto LAB_00162c43;
          }
LAB_00163077:
          ly_log(local_38,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                 "lys_node_dup_recursion");
          plVar9 = local_48;
          goto LAB_0016309b;
        }
      }
      else if (LVar3 == LYS_LIST) {
        *(undefined4 *)&local_80[1].iffeature = *(undefined4 *)&_size2[1].iffeature;
        *(undefined4 *)((long)&local_80[1].iffeature + 4) =
             *(undefined4 *)((long)&_size2[1].iffeature + 4);
        if ((lys_restr *)_size2[1].dsc != (lys_restr *)0x0) {
          plVar15 = lys_restr_dup(module,(lys_restr *)_size2[1].dsc,(uint)_size2->padding[0],iVar6,
                                  (unres_schema *)plVar28);
          plVar31[1].dsc = (char *)plVar15;
          if (plVar15 == (lys_restr *)0x0) goto LAB_0016309b;
          plVar31->padding[0] = _size2->padding[0];
        }
        plVar9 = _size2;
        if ((ulong)_size2->padding[2] != 0) {
          pvVar17 = calloc((ulong)_size2->padding[2],8);
          plVar23 = local_80;
          *(void **)&local_80[1].flags = pvVar17;
          if (pvVar17 == (void *)0x0) goto LAB_00163077;
          plVar18 = (lys_module *)lydict_insert(local_38,(char *)plVar9[1].module,0);
          plVar23[1].module = plVar18;
          plVar23->padding[2] = _size2->padding[2];
          if (iVar6 == 0) {
            iVar8 = unres_schema_add_node
                              (module,(unres_schema *)plVar28,plVar23,UNRES_LIST_KEYS,
                               (lys_node *)0x0);
            plVar9 = local_48;
            if (iVar8 == -1) goto LAB_0016309b;
          }
          else {
            memcpy(*(void **)&plVar23[1].flags,*(void **)&_size2[1].flags,
                   (ulong)_size2->padding[2] << 3);
          }
        }
        if (_size2[1].ext != (lys_ext_instance **)0x0) {
          bVar1 = _size2->padding[3];
          pplVar20 = (lys_ext_instance **)malloc((ulong)bVar1 << 4);
          plVar9 = local_48;
          plVar23 = local_80;
          local_80[1].ext = pplVar20;
          if (pplVar20 == (lys_ext_instance **)0x0) goto LAB_00163077;
          local_80->padding[3] = bVar1;
          if (bVar1 != 0) {
            uVar32 = 0;
            do {
              plVar21 = (lys_ext_instance *)
                        malloc((ulong)*(byte *)(_size2[1].ext + uVar32 * 2 + 1) << 3);
              pplVar20 = plVar23[1].ext;
              pplVar20[uVar32 * 2] = plVar21;
              if (plVar21 == (lys_ext_instance *)0x0) goto LAB_00163077;
              *(undefined1 *)(pplVar20 + uVar32 * 2 + 1) =
                   *(undefined1 *)(_size2[1].ext + uVar32 * 2 + 1);
              if (*(char *)(plVar23[1].ext + uVar32 * 2 + 1) != '\0') {
                uVar29 = 0;
                do {
                  plVar22 = (lys_ext *)
                            lydict_insert(local_38,(char *)(&_size2[1].ext[uVar32 * 2]->def)[uVar29]
                                          ,0);
                  (&plVar23[1].ext[uVar32 * 2]->def)[uVar29] = plVar22;
                  new_item = (undefined8 *)malloc(0x18);
                  if (new_item == (undefined8 *)0x0) goto LAB_00163055;
                  *new_item = plVar23;
                  pplVar20 = plVar23[1].ext;
                  new_item[1] = (&pplVar20[uVar32 * 2]->def)[uVar29];
                  new_item[2] = (long)(pplVar20 + uVar32 * 2) + 9;
                  unres_schema_dup(local_58,(unres_schema *)list_orig,&size2,UNRES_LIST_UNIQ,
                                   new_item);
                  uVar29 = uVar29 + 1;
                } while (uVar29 < *(byte *)(plVar23[1].ext + uVar32 * 2 + 1));
              }
              uVar32 = uVar32 + 1;
              iVar6 = local_4c;
            } while (uVar32 < plVar23->padding[3]);
          }
        }
        if ((lys_when *)_size2[1].name == (lys_when *)0x0) {
          return local_48;
        }
        plVar14 = lys_when_dup(local_58,(lys_when *)_size2[1].name,iVar6,(unres_schema *)list_orig);
        local_80[1].name = (char *)plVar14;
        plVar9 = local_48;
      }
      else if (LVar3 == LYS_ANYXML) {
LAB_00162915:
        if ((lys_restr *)plVar24[1].dsc != (lys_restr *)0x0) {
          plVar15 = lys_restr_dup(module,(lys_restr *)plVar24[1].dsc,(uint)plVar24->padding[3],iVar6
                                  ,(unres_schema *)plVar28);
          plVar10[1].dsc = (char *)plVar15;
          if (plVar15 == (lys_restr *)0x0) goto LAB_0016309b;
          plVar10->padding[3] = plVar24->padding[3];
        }
        if ((lys_when *)plVar24[1].name == (lys_when *)0x0) {
          return plVar9;
        }
        plVar14 = lys_when_dup(module,(lys_when *)plVar24[1].name,iVar6,(unres_schema *)plVar28);
        plVar10[1].name = (char *)plVar14;
      }
      else {
        if (LVar3 != LYS_CASE) goto switchD_00162425_caseD_3;
        if (*(lys_when **)plVar24->hash == (lys_when *)0x0) {
          return plVar9;
        }
        plVar14 = lys_when_dup(module,*(lys_when **)plVar24->hash,iVar6,(unres_schema *)plVar28);
        *(lys_when **)plVar16->hash = plVar14;
      }
joined_r0x00163051:
      if (plVar14 != (lys_when *)0x0) {
        return plVar9;
      }
      goto LAB_0016309b;
    }
    if ((int)LVar3 < 0x400) {
      if (LVar3 == LYS_NOTIF) {
        return plVar9;
      }
      if (LVar3 == LYS_RPC) {
        return plVar9;
      }
      if (LVar3 == LYS_INPUT) {
        return plVar9;
      }
    }
    else if ((int)LVar3 < 0x4000) {
      if (LVar3 == LYS_OUTPUT) {
        return plVar9;
      }
      if (LVar3 == LYS_USES) {
        plVar25[1].ref = plVar24[1].ref;
        if (*(lys_when **)plVar24->hash == (lys_when *)0x0) {
          return plVar9;
        }
        plVar14 = lys_when_dup(module,*(lys_when **)plVar24->hash,iVar6,(unres_schema *)plVar28);
        *(lys_when **)plVar25->hash = plVar14;
        goto joined_r0x00163051;
      }
    }
    else {
      if (LVar3 == LYS_ACTION) {
        return plVar9;
      }
      if (LVar3 == LYS_ANYDATA) goto LAB_00162915;
    }
switchD_00162425_caseD_3:
    uVar27 = 0xd86;
    plVar26 = local_38;
  }
  else {
    if ((int)LVar3 < 0x400) {
      if (LVar3 != LYS_NOTIF) {
        if ((LVar3 == LYS_RPC) || (LVar3 == LYS_INPUT)) goto LAB_001622b6;
        goto switchD_001621a7_caseD_3;
      }
      __size = 0x80;
LAB_001622c0:
      plVar9 = (lys_node *)calloc(1,__size);
      local_78 = (lys_node *)0x0;
      local_90 = (lys_node *)0x0;
      local_80 = (lys_node *)0x0;
      plVar10 = (lys_node *)0x0;
      _prev_ilo = (lys_node *)0x0;
      plVar23 = (lys_node *)0x0;
      local_88 = (lys_node *)0x0;
      goto LAB_001622d8;
    }
    if ((int)LVar3 < 0x4000) {
      if (LVar3 == LYS_OUTPUT) {
LAB_001622b6:
        __size = 0x78;
        goto LAB_001622c0;
      }
      if (LVar3 == LYS_USES) {
        _prev_ilo = (lys_node *)calloc(1,0x88);
        local_78 = (lys_node *)0x0;
        local_90 = (lys_node *)0x0;
        local_80 = (lys_node *)0x0;
        plVar10 = (lys_node *)0x0;
        plVar9 = _prev_ilo;
        plVar23 = (lys_node *)0x0;
        local_88 = (lys_node *)0x0;
        goto LAB_001622d8;
      }
    }
    else {
      if (LVar3 == LYS_ACTION) goto LAB_001622b6;
      if (LVar3 == LYS_ANYDATA) goto LAB_00162292;
    }
switchD_001621a7_caseD_3:
    plVar9 = (lys_node *)0x0;
    uVar27 = 0xc25;
  }
LAB_0016288b:
  ly_log(plVar26,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
         "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
         ,uVar27);
LAB_0016309b:
  lys_node_free(plVar9,(_func_void_lys_node_ptr_void_ptr *)0x0,0);
  return (lys_node *)0x0;
}

Assistant:

static struct lys_node *
lys_node_dup_recursion(struct lys_module *module, struct lys_node *parent, const struct lys_node *node,
                       struct unres_schema *unres, int shallow, int finalize)
{
    struct lys_node *retval = NULL, *iter, *p;
    struct ly_ctx *ctx = module->ctx;
    enum int_log_opts prev_ilo;
    int i, j, rc;
    unsigned int size, size1, size2;
    struct unres_list_uniq *unique_info;
    uint16_t flags;

    struct lys_node_container *cont = NULL;
    struct lys_node_container *cont_orig = (struct lys_node_container *)node;
    struct lys_node_choice *choice = NULL;
    struct lys_node_choice *choice_orig = (struct lys_node_choice *)node;
    struct lys_node_leaf *leaf = NULL;
    struct lys_node_leaf *leaf_orig = (struct lys_node_leaf *)node;
    struct lys_node_leaflist *llist = NULL;
    struct lys_node_leaflist *llist_orig = (struct lys_node_leaflist *)node;
    struct lys_node_list *list = NULL;
    struct lys_node_list *list_orig = (struct lys_node_list *)node;
    struct lys_node_anydata *any = NULL;
    struct lys_node_anydata *any_orig = (struct lys_node_anydata *)node;
    struct lys_node_uses *uses = NULL;
    struct lys_node_uses *uses_orig = (struct lys_node_uses *)node;
    struct lys_node_rpc_action *rpc = NULL;
    struct lys_node_inout *io = NULL;
    struct lys_node_notif *ntf = NULL;
    struct lys_node_case *cs = NULL;
    struct lys_node_case *cs_orig = (struct lys_node_case *)node;

    /* we cannot just duplicate memory since the strings are stored in
     * dictionary and we need to update dictionary counters.
     */

    switch (node->nodetype) {
    case LYS_CONTAINER:
        cont = calloc(1, sizeof *cont);
        retval = (struct lys_node *)cont;
        break;

    case LYS_CHOICE:
        choice = calloc(1, sizeof *choice);
        retval = (struct lys_node *)choice;
        break;

    case LYS_LEAF:
        leaf = calloc(1, sizeof *leaf);
        retval = (struct lys_node *)leaf;
        break;

    case LYS_LEAFLIST:
        llist = calloc(1, sizeof *llist);
        retval = (struct lys_node *)llist;
        break;

    case LYS_LIST:
        list = calloc(1, sizeof *list);
        retval = (struct lys_node *)list;
        break;

    case LYS_ANYXML:
    case LYS_ANYDATA:
        any = calloc(1, sizeof *any);
        retval = (struct lys_node *)any;
        break;

    case LYS_USES:
        uses = calloc(1, sizeof *uses);
        retval = (struct lys_node *)uses;
        break;

    case LYS_CASE:
        cs = calloc(1, sizeof *cs);
        retval = (struct lys_node *)cs;
        break;

    case LYS_RPC:
    case LYS_ACTION:
        rpc = calloc(1, sizeof *rpc);
        retval = (struct lys_node *)rpc;
        break;

    case LYS_INPUT:
    case LYS_OUTPUT:
        io = calloc(1, sizeof *io);
        retval = (struct lys_node *)io;
        break;

    case LYS_NOTIF:
        ntf = calloc(1, sizeof *ntf);
        retval = (struct lys_node *)ntf;
        break;

    default:
        LOGINT(ctx);
        goto error;
    }
    LY_CHECK_ERR_RETURN(!retval, LOGMEM(ctx), NULL);

    /*
     * duplicate generic part of the structure
     */
    retval->name = lydict_insert(ctx, node->name, 0);
    retval->dsc = lydict_insert(ctx, node->dsc, 0);
    retval->ref = lydict_insert(ctx, node->ref, 0);
    retval->flags = node->flags;

    retval->module = module;
    retval->nodetype = node->nodetype;

    retval->prev = retval;

    /* copying unresolved extensions is not supported */
    if (unres_schema_find(unres, -1, (void *)&node->ext, UNRES_EXT) == -1) {
        retval->ext_size = node->ext_size;
        if (lys_ext_dup(ctx, module, node->ext, node->ext_size, retval, LYEXT_PAR_NODE, &retval->ext, shallow, unres)) {
            goto error;
        }
    }

    if (node->iffeature_size) {
        retval->iffeature_size = node->iffeature_size;
        retval->iffeature = calloc(retval->iffeature_size, sizeof *retval->iffeature);
        LY_CHECK_ERR_GOTO(!retval->iffeature, LOGMEM(ctx), error);
    }

    if (!shallow) {
        for (i = 0; i < node->iffeature_size; ++i) {
            resolve_iffeature_getsizes(&node->iffeature[i], &size1, &size2);
            if (size1) {
                /* there is something to duplicate */

                /* duplicate compiled expression */
                size = (size1 / 4) + (size1 % 4) ? 1 : 0;
                retval->iffeature[i].expr = malloc(size * sizeof *retval->iffeature[i].expr);
                LY_CHECK_ERR_GOTO(!retval->iffeature[i].expr, LOGMEM(ctx), error);
                memcpy(retval->iffeature[i].expr, node->iffeature[i].expr, size * sizeof *retval->iffeature[i].expr);

                /* list of feature pointer must be updated to point to the resulting tree */
                retval->iffeature[i].features = calloc(size2, sizeof *retval->iffeature[i].features);
                LY_CHECK_ERR_GOTO(!retval->iffeature[i].features, LOGMEM(ctx); free(retval->iffeature[i].expr), error);

                for (j = 0; (unsigned int)j < size2; j++) {
                    rc = unres_schema_dup(module, unres, &node->iffeature[i].features[j], UNRES_IFFEAT,
                                          &retval->iffeature[i].features[j]);
                    if (rc == EXIT_FAILURE) {
                        /* feature is resolved in origin, so copy it
                         * - duplication is used for instantiating groupings
                         * and if-feature inside grouping is supposed to be
                         * resolved inside the original grouping, so we want
                         * to keep pointers to features from the grouping
                         * context */
                        retval->iffeature[i].features[j] = node->iffeature[i].features[j];
                    } else if (rc == -1) {
                        goto error;
                    } /* else unres was duplicated */
                }
            }

            /* duplicate if-feature's extensions */
            retval->iffeature[i].ext_size = node->iffeature[i].ext_size;
            if (lys_ext_dup(ctx, module, node->iffeature[i].ext, node->iffeature[i].ext_size,
                            &retval->iffeature[i], LYEXT_PAR_IFFEATURE, &retval->iffeature[i].ext, shallow, unres)) {
                goto error;
            }
        }

        /* inherit config flags */
        p = parent;
        do {
            for (iter = p; iter && (iter->nodetype == LYS_USES); iter = iter->parent);
        } while (iter && iter->nodetype == LYS_AUGMENT && (p = ((struct lys_node_augment *)iter)->target));
        if (iter) {
            flags = iter->flags & LYS_CONFIG_MASK;
        } else {
            /* default */
            flags = LYS_CONFIG_W;
        }

        switch (finalize) {
        case 1:
            /* inherit config flags */
            if (retval->flags & LYS_CONFIG_SET) {
                /* skip nodes with an explicit config value */
                if ((flags & LYS_CONFIG_R) && (retval->flags & LYS_CONFIG_W)) {
                    LOGVAL(ctx, LYE_INARG, LY_VLOG_LYS, retval, "true", "config");
                    LOGVAL(ctx, LYE_SPEC, LY_VLOG_PREV, NULL, "State nodes cannot have configuration nodes as children.");
                    goto error;
                }
                break;
            }

            if (retval->nodetype != LYS_USES) {
                retval->flags = (retval->flags & ~LYS_CONFIG_MASK) | flags;
            }

            /* inherit status */
            if ((parent->flags & LYS_STATUS_MASK) > (retval->flags & LYS_STATUS_MASK)) {
                /* but do it only in case the parent has a stonger status */
                retval->flags &= ~LYS_STATUS_MASK;
                retval->flags |= (parent->flags & LYS_STATUS_MASK);
            }
            break;
        case 2:
            /* erase config flags */
            retval->flags &= ~LYS_CONFIG_MASK;
            retval->flags &= ~LYS_CONFIG_SET;
            break;
        }

        /* connect it to the parent */
        if (lys_node_addchild(parent, retval->module, retval, 0)) {
            goto error;
        }

        /* go recursively */
        if (!(node->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
            LY_TREE_FOR(node->child, iter) {
                if (iter->nodetype & LYS_GROUPING) {
                    /* do not instantiate groupings */
                    continue;
                }
                if (!lys_node_dup_recursion(module, retval, iter, unres, 0, finalize)) {
                    goto error;
                }
            }
        }

        if (finalize == 1) {
            /* check that configuration lists have keys
             * - we really want to check keys_size in original node, because the keys are
             * not yet resolved here, it is done below in nodetype specific part */
            if ((retval->nodetype == LYS_LIST) && (retval->flags & LYS_CONFIG_W)
                    && !((struct lys_node_list *)node)->keys_size) {
                LOGVAL(ctx, LYE_MISSCHILDSTMT, LY_VLOG_LYS, retval, "key", "list");
                goto error;
            }
        }
    } else {
        memcpy(retval->iffeature, node->iffeature, retval->iffeature_size * sizeof *retval->iffeature);
    }

    /*
     * duplicate specific part of the structure
     */
    switch (node->nodetype) {
    case LYS_CONTAINER:
        if (cont_orig->when) {
            cont->when = lys_when_dup(module, cont_orig->when, shallow, unres);
            LY_CHECK_GOTO(!cont->when, error);
        }
        cont->presence = lydict_insert(ctx, cont_orig->presence, 0);

        if (cont_orig->must) {
            cont->must = lys_restr_dup(module, cont_orig->must, cont_orig->must_size, shallow, unres);
            LY_CHECK_GOTO(!cont->must, error);
            cont->must_size = cont_orig->must_size;
        }

        /* typedefs are not needed in instantiated grouping, nor the deviation's shallow copy */

        break;
    case LYS_CHOICE:
        if (choice_orig->when) {
            choice->when = lys_when_dup(module, choice_orig->when, shallow, unres);
            LY_CHECK_GOTO(!choice->when, error);
        }

        if (!shallow) {
            if (choice_orig->dflt) {
                rc = lys_get_sibling(choice->child, lys_node_module(retval)->name, 0, choice_orig->dflt->name, 0,
                                            LYS_ANYDATA | LYS_CASE | LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST,
                                            (const struct lys_node **)&choice->dflt);
                if (rc) {
                    if (rc == EXIT_FAILURE) {
                        LOGINT(ctx);
                    }
                    goto error;
                }
            } else {
                /* useless to check return value, we don't know whether
                * there really wasn't any default defined or it just hasn't
                * been resolved, we just hope for the best :)
                */
                unres_schema_dup(module, unres, choice_orig, UNRES_CHOICE_DFLT, choice);
            }
        } else {
            choice->dflt = choice_orig->dflt;
        }
        break;

    case LYS_LEAF:
        if (lys_type_dup(module, retval, &(leaf->type), &(leaf_orig->type), lys_ingrouping(retval), shallow, unres)) {
            goto error;
        }
        leaf->units = lydict_insert(module->ctx, leaf_orig->units, 0);

        if (leaf_orig->dflt) {
            /* transform into JSON format, may not be possible later */
            ly_ilo_change(NULL, ILO_IGNORE, &prev_ilo, NULL);
            leaf->dflt = transform_schema2json(lys_main_module(leaf_orig->module), leaf_orig->dflt);
            ly_ilo_restore(NULL, prev_ilo, NULL, 0);
            if (!leaf->dflt) {
                /* invalid identityref format or it was already transformed, so ignore the error here */
                leaf->dflt = lydict_insert(ctx, leaf_orig->dflt, 0);
            }
        }

        if (leaf_orig->must) {
            leaf->must = lys_restr_dup(module, leaf_orig->must, leaf_orig->must_size, shallow, unres);
            LY_CHECK_GOTO(!leaf->must, error);
            leaf->must_size = leaf_orig->must_size;
        }

        if (leaf_orig->when) {
            leaf->when = lys_when_dup(module, leaf_orig->when, shallow, unres);
            LY_CHECK_GOTO(!leaf->when, error);
        }
        break;

    case LYS_LEAFLIST:
        if (lys_type_dup(module, retval, &(llist->type), &(llist_orig->type), lys_ingrouping(retval), shallow, unres)) {
            goto error;
        }
        llist->units = lydict_insert(module->ctx, llist_orig->units, 0);

        llist->min = llist_orig->min;
        llist->max = llist_orig->max;

        if (llist_orig->must) {
            llist->must = lys_restr_dup(module, llist_orig->must, llist_orig->must_size, shallow, unres);
            LY_CHECK_GOTO(!llist->must, error);
            llist->must_size = llist_orig->must_size;
        }

        if (llist_orig->dflt) {
            llist->dflt = malloc(llist_orig->dflt_size * sizeof *llist->dflt);
            LY_CHECK_ERR_GOTO(!llist->dflt, LOGMEM(ctx), error);
            llist->dflt_size = llist_orig->dflt_size;

            for (i = 0; i < llist->dflt_size; i++) {
                llist->dflt[i] = lydict_insert(ctx, llist_orig->dflt[i], 0);
            }
        }

        if (llist_orig->when) {
            llist->when = lys_when_dup(module, llist_orig->when, shallow, unres);
        }
        break;

    case LYS_LIST:
        list->min = list_orig->min;
        list->max = list_orig->max;

        if (list_orig->must) {
            list->must = lys_restr_dup(module, list_orig->must, list_orig->must_size, shallow, unres);
            LY_CHECK_GOTO(!list->must, error);
            list->must_size = list_orig->must_size;
        }

        /* typedefs are not needed in instantiated grouping, nor the deviation's shallow copy */

        if (list_orig->keys_size) {
            list->keys = calloc(list_orig->keys_size, sizeof *list->keys);
            LY_CHECK_ERR_GOTO(!list->keys, LOGMEM(ctx), error);
            list->keys_str = lydict_insert(ctx, list_orig->keys_str, 0);
            list->keys_size = list_orig->keys_size;

            if (!shallow) {
                if (unres_schema_add_node(module, unres, list, UNRES_LIST_KEYS, NULL) == -1) {
                    goto error;
                }
            } else {
                memcpy(list->keys, list_orig->keys, list_orig->keys_size * sizeof *list->keys);
            }
        }

        if (list_orig->unique) {
            list->unique = malloc(list_orig->unique_size * sizeof *list->unique);
            LY_CHECK_ERR_GOTO(!list->unique, LOGMEM(ctx), error);
            list->unique_size = list_orig->unique_size;

            for (i = 0; i < list->unique_size; ++i) {
                list->unique[i].expr = malloc(list_orig->unique[i].expr_size * sizeof *list->unique[i].expr);
                LY_CHECK_ERR_GOTO(!list->unique[i].expr, LOGMEM(ctx), error);
                list->unique[i].expr_size = list_orig->unique[i].expr_size;
                for (j = 0; j < list->unique[i].expr_size; j++) {
                    list->unique[i].expr[j] = lydict_insert(ctx, list_orig->unique[i].expr[j], 0);

                    /* if it stays in unres list, duplicate it also there */
                    unique_info = malloc(sizeof *unique_info);
                    LY_CHECK_ERR_GOTO(!unique_info, LOGMEM(ctx), error);
                    unique_info->list = (struct lys_node *)list;
                    unique_info->expr = list->unique[i].expr[j];
                    unique_info->trg_type = &list->unique[i].trg_type;
                    unres_schema_dup(module, unres, &list_orig, UNRES_LIST_UNIQ, unique_info);
                }
            }
        }

        if (list_orig->when) {
            list->when = lys_when_dup(module, list_orig->when, shallow, unres);
            LY_CHECK_GOTO(!list->when, error);
        }
        break;

    case LYS_ANYXML:
    case LYS_ANYDATA:
        if (any_orig->must) {
            any->must = lys_restr_dup(module, any_orig->must, any_orig->must_size, shallow, unres);
            LY_CHECK_GOTO(!any->must, error);
            any->must_size = any_orig->must_size;
        }

        if (any_orig->when) {
            any->when = lys_when_dup(module, any_orig->when, shallow, unres);
            LY_CHECK_GOTO(!any->when, error);
        }
        break;

    case LYS_USES:
        uses->grp = uses_orig->grp;

        if (uses_orig->when) {
            uses->when = lys_when_dup(module, uses_orig->when, shallow, unres);
            LY_CHECK_GOTO(!uses->when, error);
        }
        /* it is not needed to duplicate refine, nor augment. They are already applied to the uses children */
        break;

    case LYS_CASE:
        if (cs_orig->when) {
            cs->when = lys_when_dup(module, cs_orig->when, shallow, unres);
            LY_CHECK_GOTO(!cs->when, error);
        }
        break;

    case LYS_ACTION:
    case LYS_RPC:
    case LYS_INPUT:
    case LYS_OUTPUT:
    case LYS_NOTIF:
        /* typedefs are not needed in instantiated grouping, nor the deviation's shallow copy */
        break;

    default:
        /* LY_NODE_AUGMENT */
        LOGINT(ctx);
        goto error;
    }

    return retval;

error:
    lys_node_free(retval, NULL, 0);
    return NULL;
}